

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SpecifyBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SpecifyBlockSymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  SpecifyBlockSymbol *this_00;
  
  this_00 = (SpecifyBlockSymbol *)allocate(this,0x78,8);
  ast::SpecifyBlockSymbol::SpecifyBlockSymbol(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }